

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

string * __thiscall
rcg::getString_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception,bool igncache)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  long *plVar5;
  ostringstream *this_00;
  invalid_argument *piVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  double dVar11;
  allocator local_219;
  uint8_t buffer [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  cVar1 = (char)name;
  this_00 = (ostringstream *)&out;
  std::__cxx11::ostringstream::ostringstream(this_00);
  plVar5 = *(long **)this;
  GenICam_3_4::gcstring::gcstring((gcstring *)buffer,(char *)nodemap);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x38))(plVar5,buffer);
  GenICam_3_4::gcstring::~gcstring((gcstring *)buffer);
  if (plVar5 == (long *)0x0) {
    if (cVar1 != '\0') {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_1c8,"Feature not found: ",&local_219);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     &local_1c8,(char *)nodemap);
      std::invalid_argument::invalid_argument(piVar6,(string *)buffer);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_0011789f;
  }
  iVar2 = (*(code *)**(undefined8 **)((long)plVar5 + *(long *)(*plVar5 + -0x28)))
                    ((long)plVar5 + *(long *)(*plVar5 + -0x28));
  if (1 < iVar2 - 3U) {
    if (cVar1 != '\0') {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_1c8,"Feature not readable: ",&local_219);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     &local_1c8,(char *)nodemap);
      std::invalid_argument::invalid_argument(piVar6,(string *)buffer);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_0011789f;
  }
  uVar3 = (**(code **)(*plVar5 + 0xf0))(plVar5);
  switch(uVar3) {
  case 2:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar5 + 0x48))(plVar5,0,exception);
    iVar2 = (**(code **)(*plVar5 + 0x88))(plVar5);
    if (iVar2 == 4) {
      *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) & 0xffffffb5 | 8;
    }
    else if (iVar2 == 5) {
      poVar7 = std::ostream::_M_insert<long>((long)&out);
      poVar7 = std::operator<<(poVar7,'.');
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,'.');
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      this_00 = (ostringstream *)std::operator<<(poVar7,'.');
    }
    else if (iVar2 == 6) {
      *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) & 0xffffffb5 | 8;
      std::operator<<(&out,0x30);
      *(undefined8 *)((long)&uStack_198 + *(long *)(_out + -0x18)) = 2;
      poVar7 = std::ostream::_M_insert<long>((long)&out);
      poVar7 = std::operator<<(poVar7,':');
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,':');
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,':');
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,':');
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      this_00 = (ostringstream *)std::operator<<(poVar7,':');
      *(undefined8 *)((ostream *)this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 2;
    }
    std::ostream::_M_insert<long>((long)this_00);
    break;
  case 3:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar5 + 0x48))(plVar5,0,exception);
    std::ostream::_M_insert<bool>(SUB81(&out,0));
    break;
  default:
    if (cVar1 != '\0') {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_1c8,"Feature of unknown datatype: ",&local_219);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     &local_1c8,(char *)nodemap);
      std::invalid_argument::invalid_argument(piVar6,(string *)buffer);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    break;
  case 5:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
    dVar11 = (double)(**(code **)(*plVar5 + 0x48))(plVar5,0,exception);
    std::ostream::_M_insert<double>(dVar11);
    break;
  case 6:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar5 + 0x48))(buffer,plVar5,0,exception);
    operator<<((ostream *)&out,(gcstring *)buffer);
    goto LAB_00117756;
  case 7:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    uVar4 = (**(code **)(*plVar5 + 0x48))(plVar5,0);
    uVar8 = 0x20;
    if ((int)uVar4 < 0x20) {
      uVar8 = uVar4;
    }
    uVar10 = 0;
    (**(code **)(*plVar5 + 0x40))(plVar5,buffer,(long)(int)uVar8,0,0);
    *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_out + -0x18)) & 0xffffffb5 | 8;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      poVar7 = std::operator<<(&out,0x30);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      std::ostream::operator<<(poVar7,(uint)buffer[uVar10]);
    }
    break;
  case 9:
    plVar5 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    plVar5 = (long *)(**(code **)(*plVar5 + 0x78))(plVar5,0,0);
    (**(code **)(*plVar5 + 0x40))(buffer,plVar5);
    operator<<((ostream *)&out,(gcstring *)buffer);
LAB_00117756:
    GenICam_3_4::gcstring::~gcstring((gcstring *)buffer);
  }
LAB_0011789f:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string getString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                      bool exception, bool igncache)
{
  std::ostringstream out;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);
              int64_t value=p->GetValue(false, igncache);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  out << std::hex << value;
                  break;

                case GenApi::IPV4Address:
                   out << ((value>>24)&0xff) << '.' << ((value>>16)&0xff) << '.'
                       << ((value>>8)&0xff) << '.' << (value&0xff);
                   break;

                case GenApi::MACAddress:
                   out << std::hex << std::setfill('0');
                   out << std::setw(2) << ((value>>40)&0xff) << ':'
                       << std::setw(2) << ((value>>32)&0xff) << ':'
                       << std::setw(2) << ((value>>24)&0xff) << ':'
                       << std::setw(2) << ((value>>16)&0xff) << ':'
                       << std::setw(2) << ((value>>8)&0xff) << ':'
                       << std::setw(2) << (value&0xff);
                   break;

                default:
                  out << value;
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              out << p->GetCurrentEntry()->GetSymbolic();
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              int len=std::min(static_cast<int>(p->GetLength()), 32);

              uint8_t buffer[32];
              p->Get(buffer, len);

              out << std::hex;
              for (int i=0; i<len; i++)
              {
                out << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return out.str();
}